

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void Node_AddNotify(node *Node,dataid Id,notifyproc Func,void *Referer)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 local_68 [8];
  nodenotify Origin;
  nodenotify *Ptr;
  nodenotify *n;
  nodecontext *p;
  void *Referer_local;
  notifyproc Func_local;
  dataid Id_local;
  node *Node_local;
  
  if (Node != (node *)0x0) {
    if (Node == (node *)0x0) {
      __assert_fail("(const void*)(Node)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x6fd,"void Node_AddNotify(node *, dataid, notifyproc, void *)");
    }
    lVar1 = *Node->VMT;
    Origin.Referer = Node_GetData(Node,Id,0xe);
    if (Origin.Referer == (void *)0x0) {
      memset(local_68,0,0x18);
      Origin.Referer = Node_AddData(Node,Id,0xe,local_68);
      if (Origin.Referer == (void *)0x0) {
        return;
      }
    }
    puVar2 = *(undefined8 **)(lVar1 + 0x80);
    puVar2 = (undefined8 *)(*(code *)*puVar2)(puVar2,0x18);
    if (puVar2 != (undefined8 *)0x0) {
      puVar2[1] = Func;
      puVar2[2] = Referer;
      *puVar2 = *Origin.Referer;
      *(undefined8 **)Origin.Referer = puVar2;
    }
  }
  return;
}

Assistant:

NOINLINE void Node_AddNotify(node* Node, dataid Id, notifyproc Func, void* Referer)
{
    if (Node)
    {
        nodecontext* p = Node_Context(Node);
        nodenotify* n;
        nodenotify* Ptr;

        Ptr = Node_GetData(Node,Id,TYPE_NODENOTIFY);
        if (!Ptr)
        {
            nodenotify Origin = {NULL,NULL,NULL};
            Ptr = Node_AddData(Node,Id,TYPE_NODENOTIFY,&Origin);
            if (!Ptr)
            {
                // Something went wrong ! No more memory ?
                return;
            }
        }

        n = MemHeap_Alloc(p->NodeHeap,sizeof(nodenotify));
        if (!n)
        {
            return;
        }

        n->Func = Func;
        n->Referer = Referer;
        n->Next = Ptr->Next;
        Ptr->Next = n;
    }
}